

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

int32_t ucase_hasBinaryProperty_63(UChar32 c,UProperty which)

{
  UBool UVar1;
  int32_t iVar2;
  bool local_29;
  UChar *local_20;
  UChar *resultString;
  UChar32 local_10;
  UProperty which_local;
  UChar32 c_local;
  
  resultString._4_4_ = which;
  local_10 = c;
  switch(which) {
  case UCHAR_LOWERCASE:
    iVar2 = ucase_getType_63(c);
    which_local = (UProperty)(iVar2 == 1);
    break;
  default:
    which_local = UCHAR_ALPHABETIC;
    break;
  case UCHAR_SOFT_DOTTED:
    UVar1 = ucase_isSoftDotted_63(c);
    which_local = (UProperty)UVar1;
    break;
  case UCHAR_UPPERCASE:
    iVar2 = ucase_getType_63(c);
    which_local = (UProperty)(iVar2 == 2);
    break;
  case UCHAR_CASE_SENSITIVE:
    UVar1 = ucase_isCaseSensitive_63(c);
    which_local = (UProperty)UVar1;
    break;
  case UCHAR_CASED:
    iVar2 = ucase_getType_63(c);
    which_local = (UProperty)(iVar2 != 0);
    break;
  case UCHAR_CASE_IGNORABLE:
    iVar2 = ucase_getTypeOrIgnorable_63(c);
    which_local = (UProperty)(char)(iVar2 >> 2);
    break;
  case UCHAR_CHANGES_WHEN_LOWERCASED:
    iVar2 = ucase_toFullLower_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&local_20,1);
    which_local = (UProperty)(-1 < iVar2);
    break;
  case UCHAR_CHANGES_WHEN_UPPERCASED:
    iVar2 = ucase_toFullUpper_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&local_20,1);
    which_local = (UProperty)(-1 < iVar2);
    break;
  case UCHAR_CHANGES_WHEN_TITLECASED:
    iVar2 = ucase_toFullTitle_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&local_20,1);
    which_local = (UProperty)(-1 < iVar2);
    break;
  case UCHAR_CHANGES_WHEN_CASEMAPPED:
    iVar2 = ucase_toFullLower_63(c,(UCaseContextIterator *)0x0,(void *)0x0,&local_20,1);
    local_29 = true;
    if (iVar2 < 0) {
      iVar2 = ucase_toFullUpper_63(local_10,(UCaseContextIterator *)0x0,(void *)0x0,&local_20,1);
      local_29 = true;
      if (iVar2 < 0) {
        iVar2 = ucase_toFullTitle_63(local_10,(UCaseContextIterator *)0x0,(void *)0x0,&local_20,1);
        local_29 = -1 < iVar2;
      }
    }
    which_local = (UProperty)local_29;
  }
  return which_local;
}

Assistant:

U_CFUNC int32_t U_EXPORT2
ucase_hasBinaryProperty(UChar32 c, UProperty which) {
    /* case mapping properties */
    const UChar *resultString;
    switch(which) {
    case UCHAR_LOWERCASE:
        return (UBool)(UCASE_LOWER==ucase_getType(c));
    case UCHAR_UPPERCASE:
        return (UBool)(UCASE_UPPER==ucase_getType(c));
    case UCHAR_SOFT_DOTTED:
        return ucase_isSoftDotted(c);
    case UCHAR_CASE_SENSITIVE:
        return ucase_isCaseSensitive(c);
    case UCHAR_CASED:
        return (UBool)(UCASE_NONE!=ucase_getType(c));
    case UCHAR_CASE_IGNORABLE:
        return (UBool)(ucase_getTypeOrIgnorable(c)>>2);
    /*
     * Note: The following Changes_When_Xyz are defined as testing whether
     * the NFD form of the input changes when Xyz-case-mapped.
     * However, this simpler implementation of these properties,
     * ignoring NFD, passes the tests.
     * The implementation needs to be changed if the tests start failing.
     * When that happens, optimizations should be used to work with the
     * per-single-code point ucase_toFullXyz() functions unless
     * the NFD form has more than one code point,
     * and the property starts set needs to be the union of the
     * start sets for normalization and case mappings.
     */
    case UCHAR_CHANGES_WHEN_LOWERCASED:
        return (UBool)(ucase_toFullLower(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    case UCHAR_CHANGES_WHEN_UPPERCASED:
        return (UBool)(ucase_toFullUpper(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    case UCHAR_CHANGES_WHEN_TITLECASED:
        return (UBool)(ucase_toFullTitle(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    /* case UCHAR_CHANGES_WHEN_CASEFOLDED: -- in uprops.c */
    case UCHAR_CHANGES_WHEN_CASEMAPPED:
        return (UBool)(
            ucase_toFullLower(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0 ||
            ucase_toFullUpper(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0 ||
            ucase_toFullTitle(c, NULL, NULL, &resultString, UCASE_LOC_ROOT)>=0);
    default:
        return FALSE;
    }
}